

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

int GetKeyPressed(void)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  iVar1 = CORE.Input.Keyboard.keyPressedQueue[0];
  if (CORE.Input.Keyboard.keyPressedQueueCount < 1) {
    return 0;
  }
  if (CORE.Input.Keyboard.keyPressedQueueCount < 2) {
    uVar2 = (ulong)(CORE.Input.Keyboard.keyPressedQueueCount - 1);
  }
  else {
    lVar3 = 0;
    do {
      CORE.Input.Keyboard.keyPressedQueue[lVar3] = CORE.Input.Keyboard.keyPressedQueue[lVar3 + 1];
      lVar3 = lVar3 + 1;
      uVar2 = (long)CORE.Input.Keyboard.keyPressedQueueCount - 1;
    } while (lVar3 < (long)uVar2);
  }
  CORE.Input.Keyboard.keyPressedQueue[(int)uVar2] = 0;
  CORE.Input.Keyboard.keyPressedQueueCount = CORE.Input.Keyboard.keyPressedQueueCount + -1;
  return iVar1;
}

Assistant:

int GetKeyPressed(void)
{
    int value = 0;

    if (CORE.Input.Keyboard.keyPressedQueueCount > 0)
    {
        // Get character from the queue head
        value = CORE.Input.Keyboard.keyPressedQueue[0];

        // Shift elements 1 step toward the head
        for (int i = 0; i < (CORE.Input.Keyboard.keyPressedQueueCount - 1); i++)
            CORE.Input.Keyboard.keyPressedQueue[i] = CORE.Input.Keyboard.keyPressedQueue[i + 1];

        // Reset last character in the queue
        CORE.Input.Keyboard.keyPressedQueue[CORE.Input.Keyboard.keyPressedQueueCount - 1] = 0;
        CORE.Input.Keyboard.keyPressedQueueCount--;
    }

    return value;
}